

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O3

bool __thiscall
jrtplib::RTPExternalTransmitter::ComesFromThisTransmitter
          (RTPExternalTransmitter *this,RTPAddress *addr)

{
  undefined1 uVar1;
  
  if (this->sender != (RTPExternalSender *)0x0) {
    uVar1 = (**(code **)(*(long *)this->sender + 0x20))();
    return (bool)uVar1;
  }
  return false;
}

Assistant:

bool RTPExternalTransmitter::ComesFromThisTransmitter(const RTPAddress *addr)
{
	MAINMUTEX_LOCK
	bool value = false;
	if (sender)
		value = sender->ComesFromThisSender(addr);
	MAINMUTEX_UNLOCK
	return value;
}